

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionCordAccessorsTest_GetCord_Test::
~GeneratedMessageReflectionCordAccessorsTest_GetCord_Test
          (GeneratedMessageReflectionCordAccessorsTest_GetCord_Test *this)

{
  (this->super_GeneratedMessageReflectionCordAccessorsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionCordAccessorsTest_0189a6b8;
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            (&(this->super_GeneratedMessageReflectionCordAccessorsTest).extensions_message_);
  proto2_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_GeneratedMessageReflectionCordAccessorsTest).message_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,1000);
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, GetCord) {
  message_.set_optional_string("foo");

  extensions_message_.SetExtension(unittest::optional_string_extension, "moo");

  EXPECT_EQ("foo", reflection_->GetCord(message_, optional_string_));
  EXPECT_EQ("moo", extensions_reflection_->GetCord(extensions_message_,
                                                   optional_string_extension_));

  EXPECT_EQ("hello", reflection_->GetCord(message_, default_string_));
  EXPECT_EQ("abc", reflection_->GetCord(message_, default_string_piece_));
  EXPECT_EQ("123", reflection_->GetCord(message_, default_cord_));


  unittest::TestCord message;
  const Descriptor* descriptor = unittest::TestCord::descriptor();
  const Reflection* reflection = message.GetReflection();

  message.set_optional_bytes_cord("bytes_cord");
  EXPECT_EQ("bytes_cord",
            reflection->GetCord(
                message, descriptor->FindFieldByName("optional_bytes_cord")));
}